

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean jpeg_resync_to_restart(j_decompress_ptr cinfo,int desired)

{
  boolean bVar1;
  int in_ESI;
  long *in_RDI;
  int action;
  int marker;
  int local_1c;
  int local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_18 = *(int *)((long)in_RDI + 0x21c);
  *(undefined4 *)(*in_RDI + 0x28) = 0x79;
  *(int *)(*in_RDI + 0x2c) = local_18;
  *(int *)(*in_RDI + 0x30) = in_ESI;
  (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
  while( true ) {
    if (local_18 < 0xc0) {
      local_1c = 2;
    }
    else if ((local_18 < 0xd0) || (0xd7 < local_18)) {
      local_1c = 3;
    }
    else if ((local_18 == (in_ESI + 1U & 7) + 0xd0) || (local_18 == (in_ESI + 2U & 7) + 0xd0)) {
      local_1c = 3;
    }
    else if ((local_18 == (in_ESI - 1U & 7) + 0xd0) || (local_18 == (in_ESI - 2U & 7) + 0xd0)) {
      local_1c = 2;
    }
    else {
      local_1c = 1;
    }
    *(undefined4 *)(*in_RDI + 0x28) = 0x61;
    *(int *)(*in_RDI + 0x2c) = local_18;
    *(int *)(*in_RDI + 0x30) = local_1c;
    (**(code **)(*in_RDI + 8))(in_RDI,4);
    if (local_1c == 1) break;
    if (local_1c == 2) {
      bVar1 = next_marker((j_decompress_ptr)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (bVar1 == 0) {
        return 0;
      }
      local_18 = *(int *)((long)in_RDI + 0x21c);
    }
    else if (local_1c == 3) {
      return 1;
    }
  }
  *(undefined4 *)((long)in_RDI + 0x21c) = 0;
  return 1;
}

Assistant:

GLOBAL(boolean)
jpeg_resync_to_restart(j_decompress_ptr cinfo, int desired)
{
  int marker = cinfo->unread_marker;
  int action = 1;

  /* Always put up a warning. */
  WARNMS2(cinfo, JWRN_MUST_RESYNC, marker, desired);

  /* Outer loop handles repeated decision after scanning forward. */
  for (;;) {
    if (marker < (int)M_SOF0)
      action = 2;               /* invalid marker */
    else if (marker < (int)M_RST0 || marker > (int)M_RST7)
      action = 3;               /* valid non-restart marker */
    else {
      if (marker == ((int)M_RST0 + ((desired + 1) & 7)) ||
          marker == ((int)M_RST0 + ((desired + 2) & 7)))
        action = 3;             /* one of the next two expected restarts */
      else if (marker == ((int)M_RST0 + ((desired - 1) & 7)) ||
               marker == ((int)M_RST0 + ((desired - 2) & 7)))
        action = 2;             /* a prior restart, so advance */
      else
        action = 1;             /* desired restart or too far away */
    }
    TRACEMS2(cinfo, 4, JTRC_RECOVERY_ACTION, marker, action);
    switch (action) {
    case 1:
      /* Discard marker and let entropy decoder resume processing. */
      cinfo->unread_marker = 0;
      return TRUE;
    case 2:
      /* Scan to the next marker, and repeat the decision loop. */
      if (!next_marker(cinfo))
        return FALSE;
      marker = cinfo->unread_marker;
      break;
    case 3:
      /* Return without advancing past this marker. */
      /* Entropy decoder will be forced to process an empty segment. */
      return TRUE;
    }
  } /* end loop */
}